

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::findAndReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *oldText,int32_t oldStart,
          int32_t oldLength,UnicodeString *newText,int32_t newStart,int32_t newLength)

{
  UBool UVar1;
  int32_t start_00;
  int32_t local_30;
  int32_t pos;
  int32_t oldLength_local;
  int32_t oldStart_local;
  UnicodeString *oldText_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  local_30 = oldLength;
  pos = oldStart;
  _oldLength_local = oldText;
  oldText_local._0_4_ = length;
  oldText_local._4_4_ = start;
  _length_local = this;
  UVar1 = isBogus(this);
  if (((UVar1 == '\0') && (UVar1 = isBogus(_oldLength_local), UVar1 == '\0')) &&
     (UVar1 = isBogus(newText), UVar1 == '\0')) {
    pinIndices(this,(int32_t *)((long)&oldText_local + 4),(int32_t *)&oldText_local);
    pinIndices(_oldLength_local,&pos,&local_30);
    pinIndices(newText,&newStart,&newLength);
    if (local_30 != 0) {
      while ((0 < (int32_t)oldText_local && local_30 <= (int32_t)oldText_local &&
             (start_00 = indexOf(this,_oldLength_local,pos,local_30,oldText_local._4_4_,
                                 (int32_t)oldText_local), -1 < start_00))) {
        replace(this,start_00,local_30,newText,newStart,newLength);
        oldText_local._0_4_ = (int32_t)oldText_local - ((start_00 + local_30) - oldText_local._4_4_)
        ;
        oldText_local._4_4_ = start_00 + newLength;
      }
    }
  }
  return this;
}

Assistant:

UnicodeString& 
UnicodeString::findAndReplace(int32_t start,
                  int32_t length,
                  const UnicodeString& oldText,
                  int32_t oldStart,
                  int32_t oldLength,
                  const UnicodeString& newText,
                  int32_t newStart,
                  int32_t newLength)
{
  if(isBogus() || oldText.isBogus() || newText.isBogus()) {
    return *this;
  }

  pinIndices(start, length);
  oldText.pinIndices(oldStart, oldLength);
  newText.pinIndices(newStart, newLength);

  if(oldLength == 0) {
    return *this;
  }

  while(length > 0 && length >= oldLength) {
    int32_t pos = indexOf(oldText, oldStart, oldLength, start, length);
    if(pos < 0) {
      // no more oldText's here: done
      break;
    } else {
      // we found oldText, replace it by newText and go beyond it
      replace(pos, oldLength, newText, newStart, newLength);
      length -= pos + oldLength - start;
      start = pos + newLength;
    }
  }

  return *this;
}